

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_type.cpp
# Opt level: O0

bool __thiscall pstore::brokerface::message_type::operator==(message_type *this,message_type *rhs)

{
  bool local_19;
  message_type *rhs_local;
  message_type *this_local;
  
  local_19 = false;
  if ((((this->sender_id == rhs->sender_id) &&
       (local_19 = false, this->message_id == rhs->message_id)) &&
      (local_19 = false, this->part_no == rhs->part_no)) &&
     (local_19 = false, this->num_parts == rhs->num_parts)) {
    local_19 = std::operator==(&this->payload,&rhs->payload);
  }
  return local_19;
}

Assistant:

bool message_type::operator== (message_type const & rhs) const {
            return sender_id == rhs.sender_id && message_id == rhs.message_id &&
                   part_no == rhs.part_no && num_parts == rhs.num_parts && payload == rhs.payload;
        }